

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void skip_spaces(FT_Byte **acur,FT_Byte *limit)

{
  ulong uVar1;
  byte *local_28;
  
  local_28 = *acur;
  do {
    if ((limit <= local_28) || (uVar1 = (ulong)*local_28, 0x25 < uVar1)) goto LAB_001f4dff;
    if ((0x100003601U >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 != 0x25) {
LAB_001f4dff:
        *acur = local_28;
        return;
      }
      skip_comment(&local_28,limit);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static void
  skip_spaces( FT_Byte*  *acur,
               FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( !IS_PS_SPACE( *cur ) )
      {
        if ( *cur == '%' )
          /* According to the PLRM, a comment is equal to a space. */
          skip_comment( &cur, limit );
        else
          break;
      }
      cur++;
    }

    *acur = cur;
  }